

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FieldOptions::MergeFrom(FieldOptions *this,FieldOptions *from)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x1679);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(from->uninterpreted_option_).super_RepeatedPtrFieldBase);
  bVar1 = (byte)from->_has_bits_[0];
  uVar3 = (uint)bVar1;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      set_ctype(this,from->ctype_);
      uVar3 = from->_has_bits_[0];
    }
    if ((uVar3 & 2) != 0) {
      bVar2 = from->packed_;
      this->_has_bits_[0] = this->_has_bits_[0] | 2;
      this->packed_ = bVar2;
      uVar3 = from->_has_bits_[0];
    }
    if ((uVar3 & 4) != 0) {
      bVar2 = from->lazy_;
      this->_has_bits_[0] = this->_has_bits_[0] | 4;
      this->lazy_ = bVar2;
      uVar3 = from->_has_bits_[0];
    }
    if ((uVar3 & 8) != 0) {
      bVar2 = from->deprecated_;
      this->_has_bits_[0] = this->_has_bits_[0] | 8;
      this->deprecated_ = bVar2;
      uVar3 = from->_has_bits_[0];
    }
    if ((uVar3 & 0x10) != 0) {
      set_experimental_map_key(this,from->experimental_map_key_);
      uVar3 = from->_has_bits_[0];
    }
    if ((uVar3 & 0x20) != 0) {
      bVar2 = from->weak_;
      this->_has_bits_[0] = this->_has_bits_[0] | 0x20;
      this->weak_ = bVar2;
    }
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void FieldOptions::MergeFrom(const FieldOptions& from) {
  GOOGLE_CHECK_NE(&from, this);
  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_ctype()) {
      set_ctype(from.ctype());
    }
    if (from.has_packed()) {
      set_packed(from.packed());
    }
    if (from.has_lazy()) {
      set_lazy(from.lazy());
    }
    if (from.has_deprecated()) {
      set_deprecated(from.deprecated());
    }
    if (from.has_experimental_map_key()) {
      set_experimental_map_key(from.experimental_map_key());
    }
    if (from.has_weak()) {
      set_weak(from.weak());
    }
  }
  _extensions_.MergeFrom(from._extensions_);
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}